

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Address *a)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,(string *)a);
  poVar1 = std::operator<<(poVar1," , ");
  poVar1 = std::operator<<(poVar1,(string *)&a->city);
  poVar1 = std::operator<<(poVar1," , ");
  std::operator<<(poVar1,(string *)&a->street);
  return out;
}

Assistant:

ostream &operator<<(ostream &out, const Address &a) {
    out << a.country << " , " << a.city << " , " << a.street;
    return out;
}